

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *file,
          Options *options)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  size_type __rlen_2;
  void *pvVar4;
  ulong uVar5;
  char *pcVar7;
  string *extraout_RAX;
  string *psVar8;
  uint uVar9;
  long *plVar10;
  int iVar11;
  size_type sVar12;
  char *__end;
  _anonymous_namespace_ *p_Var14;
  FileDescriptor *in_R8;
  size_type __n;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  string_view name;
  string_view classname;
  string_view name_00;
  string_view classname_00;
  string segment;
  string result;
  size_type __dnew;
  long *local_158;
  php *local_150;
  long local_148 [2];
  string *local_138;
  size_type local_130;
  undefined1 local_128 [24];
  undefined1 local_110 [48];
  string local_e0;
  undefined1 local_c0 [48];
  AlphaNum local_90;
  AlphaNum local_60;
  ulong uVar6;
  ulong uVar13;
  
  pcVar7 = (char *)**(undefined8 **)(this + 8);
  uVar13 = (*(undefined8 **)(this + 8))[1];
  local_128._16_8_ = this;
  if (uVar13 == 0) {
    uVar9 = 0xffffffff;
  }
  else {
    pvVar4 = memchr(pcVar7,0x2f,uVar13);
    uVar9 = (int)pvVar4 - (int)pcVar7;
    options = (Options *)(ulong)uVar9;
    uVar9 = -(uint)(pvVar4 == (void *)0x0) | uVar9;
  }
  local_138 = (string *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"","",options);
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"","");
  uVar6 = uVar13;
  if (uVar13 == 0x1b) {
    auVar18[0] = -(pcVar7[0xb] == 'o');
    auVar18[1] = -(pcVar7[0xc] == 'b');
    auVar18[2] = -(pcVar7[0xd] == 'u');
    auVar18[3] = -(pcVar7[0xe] == 'f');
    auVar18[4] = -(pcVar7[0xf] == '/');
    auVar18[5] = -(pcVar7[0x10] == 'e');
    auVar18[6] = -(pcVar7[0x11] == 'm');
    auVar18[7] = -(pcVar7[0x12] == 'p');
    auVar18[8] = -(pcVar7[0x13] == 't');
    auVar18[9] = -(pcVar7[0x14] == 'y');
    auVar18[10] = -(pcVar7[0x15] == '.');
    auVar18[0xb] = -(pcVar7[0x16] == 'p');
    auVar18[0xc] = -(pcVar7[0x17] == 'r');
    auVar18[0xd] = -(pcVar7[0x18] == 'o');
    auVar18[0xe] = -(pcVar7[0x19] == 't');
    auVar18[0xf] = -(pcVar7[0x1a] == 'o');
    auVar16[0] = -(*pcVar7 == 'g');
    auVar16[1] = -(pcVar7[1] == 'o');
    auVar16[2] = -(pcVar7[2] == 'o');
    auVar16[3] = -(pcVar7[3] == 'g');
    auVar16[4] = -(pcVar7[4] == 'l');
    auVar16[5] = -(pcVar7[5] == 'e');
    auVar16[6] = -(pcVar7[6] == '/');
    auVar16[7] = -(pcVar7[7] == 'p');
    auVar16[8] = -(pcVar7[8] == 'r');
    auVar16[9] = -(pcVar7[9] == 'o');
    auVar16[10] = -(pcVar7[10] == 't');
    auVar16[0xb] = -(pcVar7[0xb] == 'o');
    auVar16[0xc] = -(pcVar7[0xc] == 'b');
    auVar16[0xd] = -(pcVar7[0xd] == 'u');
    auVar16[0xe] = -(pcVar7[0xe] == 'f');
    auVar16[0xf] = -(pcVar7[0xf] == '/');
    auVar16 = auVar16 & auVar18;
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      local_110._0_8_ = 0x28;
      pcVar7 = (char *)std::__cxx11::string::_M_create
                                 ((ulong *)__return_storage_ptr__,(ulong)local_110);
    }
    else {
      if (*file == (FileDescriptor)0x1) goto LAB_002e9d8d;
LAB_002e9df3:
      do {
        uVar5 = uVar6 - 1;
        if (uVar6 == 0) {
          uVar5 = 0xffffffffffffffff;
          break;
        }
        lVar2 = uVar6 - 1;
        uVar6 = uVar5;
      } while (pcVar7[lVar2] != '.');
      iVar15 = (int)uVar5;
      if ((uVar13 != 0x1b) ||
         (auVar19[0] = -(pcVar7[0xb] == 'o'), auVar19[1] = -(pcVar7[0xc] == 'b'),
         auVar19[2] = -(pcVar7[0xd] == 'u'), auVar19[3] = -(pcVar7[0xe] == 'f'),
         auVar19[4] = -(pcVar7[0xf] == '/'), auVar19[5] = -(pcVar7[0x10] == 'e'),
         auVar19[6] = -(pcVar7[0x11] == 'm'), auVar19[7] = -(pcVar7[0x12] == 'p'),
         auVar19[8] = -(pcVar7[0x13] == 't'), auVar19[9] = -(pcVar7[0x14] == 'y'),
         auVar19[10] = -(pcVar7[0x15] == '.'), auVar19[0xb] = -(pcVar7[0x16] == 'p'),
         auVar19[0xc] = -(pcVar7[0x17] == 'r'), auVar19[0xd] = -(pcVar7[0x18] == 'o'),
         auVar19[0xe] = -(pcVar7[0x19] == 't'), auVar19[0xf] = -(pcVar7[0x1a] == 'o'),
         auVar17[0] = -(*pcVar7 == 'g'), auVar17[1] = -(pcVar7[1] == 'o'),
         auVar17[2] = -(pcVar7[2] == 'o'), auVar17[3] = -(pcVar7[3] == 'g'),
         auVar17[4] = -(pcVar7[4] == 'l'), auVar17[5] = -(pcVar7[5] == 'e'),
         auVar17[6] = -(pcVar7[6] == '/'), auVar17[7] = -(pcVar7[7] == 'p'),
         auVar17[8] = -(pcVar7[8] == 'r'), auVar17[9] = -(pcVar7[9] == 'o'),
         auVar17[10] = -(pcVar7[10] == 't'), auVar17[0xb] = -(pcVar7[0xb] == 'o'),
         auVar17[0xc] = -(pcVar7[0xc] == 'b'), auVar17[0xd] = -(pcVar7[0xd] == 'u'),
         auVar17[0xe] = -(pcVar7[0xe] == 'f'), auVar17[0xf] = -(pcVar7[0xf] == '/'),
         auVar17 = auVar17 & auVar19,
         (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_002e9ec6;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      local_110._0_8_ = 0x28;
      pcVar7 = (char *)std::__cxx11::string::_M_create
                                 ((ulong *)__return_storage_ptr__,(ulong)local_110);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_110._0_8_;
    builtin_strncpy(pcVar7,"GPBMetadata/Google/Protobuf/GPBEmpty.php",0x28);
  }
  else {
    if (*file == (FileDescriptor)0x0) {
      if (uVar13 != 0) goto LAB_002e9df3;
      iVar15 = -1;
LAB_002e9ec6:
      uVar6 = (long)iVar15;
      if (uVar13 < (ulong)(long)iVar15) {
        uVar6 = uVar13;
      }
      uVar13 = uVar6;
      if ((*(byte *)(*(long *)(local_128._16_8_ + 0x80) + 0x29) & 1) == 0) {
        local_110._0_8_ = (char *)0xc;
        local_110._8_8_ = "GPBMetadata/";
        absl::lts_20240722::StrAppend((string *)&local_138,(AlphaNum *)local_110);
        if (uVar9 == 0xffffffff) {
LAB_002ea0fe:
          uVar9 = 0xffffffff;
          goto LAB_002ea104;
        }
        iVar15 = 0;
        do {
          uVar5 = (ulong)iVar15;
          if (uVar6 < uVar5) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",uVar5,uVar6);
          }
          name._M_str._0_4_ = uVar9 - iVar15;
          p_Var14 = (_anonymous_namespace_ *)(long)(int)name._M_str;
          if ((_anonymous_namespace_ *)(uVar6 - uVar5) <
              (_anonymous_namespace_ *)(long)(int)name._M_str) {
            p_Var14 = (_anonymous_namespace_ *)(uVar6 - uVar5);
          }
          name._M_len = pcVar7 + uVar5;
          name._M_str._4_4_ = 0;
          UnderscoresToCamelCase_abi_cxx11_((string *)local_110,p_Var14,name,SUB81(in_R8,0));
          std::__cxx11::string::operator=((string *)&local_158,(string *)local_110);
          if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
          classname._M_str = (char *)local_128._16_8_;
          classname._M_len = (size_t)local_158;
          ReservedNamePrefix_abi_cxx11_((string *)local_c0,local_150,classname,in_R8);
          local_110._0_8_ = local_c0._8_8_;
          local_110._8_8_ = local_c0._0_8_;
          local_60.piece_._M_len = (size_t)local_150;
          local_60.piece_._M_str = (char *)local_158;
          local_90.piece_._M_len = 1;
          local_90.piece_._M_str = "/";
          absl::lts_20240722::StrAppend
                    ((string *)&local_138,(AlphaNum *)local_110,&local_60,&local_90);
          if ((string *)local_c0._0_8_ != (string *)(local_c0 + 0x10)) {
            operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
          }
          iVar15 = uVar9 + 1;
          uVar5 = (ulong)iVar15;
          if (uVar6 < uVar5 || uVar6 - uVar5 == 0) goto LAB_002ea0fe;
          pvVar4 = memchr(pcVar7 + uVar5,0x2f,uVar6 - uVar5);
          uVar3 = 0xffffffff;
        } while ((pvVar4 != (void *)0x0) && (uVar9 = (int)pvVar4 - (int)pcVar7, uVar9 != 0xffffffff)
                );
LAB_002ea112:
        do {
          uVar9 = uVar3;
          uVar5 = uVar13 - 1;
          if (uVar13 == 0) {
            uVar5 = 0xffffffffffffffff;
            break;
          }
          lVar2 = uVar13 - 1;
          uVar13 = uVar5;
          uVar3 = uVar9;
        } while (pcVar7[lVar2] != '/');
        iVar15 = (int)uVar5;
      }
      else {
        plVar10 = (long *)(*(ulong *)(*(long *)(local_128._16_8_ + 0x80) + 0x88) &
                          0xfffffffffffffffc);
        pcVar1 = (char *)plVar10[1];
        if ((pcVar1 != (char *)0x0) &&
           ((psVar8 = (string *)*plVar10, pcVar1 != (char *)0x1 ||
            (*(char *)&(psVar8->_M_dataplus)._M_p != '\\')))) {
          local_110._0_8_ = pcVar1;
          local_110._8_8_ = psVar8;
          absl::lts_20240722::StrAppend((string *)&local_138,(AlphaNum *)local_110);
          if (local_130 == 0) {
LAB_002ea2ba:
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                       0xffffffffffffffff,0);
          }
          sVar12 = 0;
          do {
            if (*(char *)((long)&(local_138->_M_dataplus)._M_p + sVar12) == '\\') {
              *(char *)((long)&(local_138->_M_dataplus)._M_p + sVar12) = '/';
            }
            sVar12 = sVar12 + 1;
          } while (local_130 != sVar12);
          if (local_130 == 0) goto LAB_002ea2ba;
          if (*(char *)((long)local_138 + (local_130 - 1)) != '/') {
            local_110._0_8_ = (char *)0x1;
            local_110._8_8_ = "/";
            absl::lts_20240722::StrAppend((string *)&local_138,(AlphaNum *)local_110);
          }
        }
LAB_002ea104:
        uVar3 = uVar9;
        if (uVar6 != 0) goto LAB_002ea112;
        iVar15 = -1;
      }
      name_00._M_str._0_4_ = iVar15 + 1;
      iVar11 = 0;
      if (iVar15 != -1) {
        iVar11 = (int)name_00._M_str;
      }
      uVar13 = (ulong)iVar11;
      if (uVar6 < uVar13) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar13,uVar6);
      }
      p_Var14 = (_anonymous_namespace_ *)(long)(int)(uVar9 - iVar11);
      if ((_anonymous_namespace_ *)(uVar6 - uVar13) <
          (_anonymous_namespace_ *)(long)(int)(uVar9 - iVar11)) {
        p_Var14 = (_anonymous_namespace_ *)(uVar6 - uVar13);
      }
      name_00._M_len = (size_t)(pcVar7 + uVar13);
      name_00._M_str._4_4_ = 0;
      UnderscoresToCamelCase_abi_cxx11_((string *)local_110,p_Var14,name_00,SUB81(in_R8,0));
      std::__cxx11::string::operator=((string *)&local_158,(string *)local_110);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_130;
      local_110._8_8_ = local_138;
      classname_00._M_str = (char *)local_128._16_8_;
      classname_00._M_len = (size_t)local_158;
      ReservedNamePrefix_abi_cxx11_(&local_e0,local_150,classname_00,in_R8);
      local_60.piece_._M_len = local_e0._M_string_length;
      local_60.piece_._M_str = local_e0._M_dataplus._M_p;
      local_90.piece_._M_len = (size_t)local_150;
      local_90.piece_._M_str = (char *)local_158;
      local_c0._0_8_ = (string *)0x4;
      local_c0._8_8_ = ".php";
      absl::lts_20240722::StrCat_abi_cxx11_
                ((AlphaNum *)__return_storage_ptr__,(AlphaNum *)local_110,&local_60,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002ea241;
    }
LAB_002e9d8d:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_110._0_8_ = 0x33;
    pcVar7 = (char *)std::__cxx11::string::_M_create
                               ((ulong *)__return_storage_ptr__,(ulong)local_110);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_110._0_8_;
    builtin_strncpy(pcVar7,"GPBMetadata/Google/Protobuf/Internal/Descriptor.php",0x33);
  }
  __return_storage_ptr__->_M_string_length = local_110._0_8_;
  (__return_storage_ptr__->_M_dataplus)._M_p[local_110._0_8_] = '\0';
LAB_002ea241:
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  psVar8 = (string *)local_128;
  if (local_138 != psVar8) {
    operator_delete(local_138,(ulong)(local_128._0_8_ + 1));
    psVar8 = extraout_RAX;
  }
  return psVar8;
}

Assistant:

std::string GeneratedMetadataFileName(const FileDescriptor* file,
                                      const Options& options) {
  absl::string_view proto_file = file->name();
  int start_index = 0;
  int first_index = proto_file.find_first_of('/', start_index);
  std::string result = "";
  std::string segment = "";

  if (proto_file == kEmptyFile) {
    return std::string(kEmptyMetadataFile);
  }
  if (options.is_descriptor) {
    return std::string(kDescriptorMetadataFile);
  }

  // Append directory name.
  absl::string_view file_no_suffix;
  int lastindex = proto_file.find_last_of('.');
  if (proto_file == kEmptyFile) {
    return std::string(kEmptyMetadataFile);
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  if (file->options().has_php_metadata_namespace()) {
    absl::string_view php_metadata_namespace =
        file->options().php_metadata_namespace();
    if (!php_metadata_namespace.empty() && php_metadata_namespace != "\\") {
      absl::StrAppend(&result, php_metadata_namespace);
      std::replace(result.begin(), result.end(), '\\', '/');
      if (result.at(result.size() - 1) != '/') {
        absl::StrAppend(&result, "/");
      }
    }
  } else {
    absl::StrAppend(&result, "GPBMetadata/");
    while (first_index != std::string::npos) {
      segment = UnderscoresToCamelCase(
          file_no_suffix.substr(start_index, first_index - start_index), true);
      absl::StrAppend(&result, ReservedNamePrefix(segment, file), segment, "/");
      start_index = first_index + 1;
      first_index = file_no_suffix.find_first_of('/', start_index);
    }
  }

  // Append file name.
  int file_name_start = file_no_suffix.find_last_of('/');
  if (file_name_start == std::string::npos) {
    file_name_start = 0;
  } else {
    file_name_start += 1;
  }
  segment = UnderscoresToCamelCase(
      file_no_suffix.substr(file_name_start, first_index - file_name_start),
      true);

  return absl::StrCat(result, ReservedNamePrefix(segment, file), segment,
                      ".php");
}